

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

int xercesc_4_0::XMLString::compareString(XMLCh *str1,XMLCh *str2)

{
  XMLCh *pXVar1;
  short *psVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  XMLCh XVar6;
  XMLCh *psz2;
  XMLCh *psz1;
  
  if (str1 == (XMLCh *)0x0 || str2 == (XMLCh *)0x0) {
    if (str1 == (XMLCh *)0x0) {
      if (str2 == (XMLCh *)0x0) {
        return 0;
      }
      uVar4 = 0;
      do {
        psVar2 = (short *)((long)str2 + uVar4);
        uVar4 = uVar4 + 2;
      } while (*psVar2 != 0);
      return 1 - (int)(uVar4 >> 1);
    }
    if (str2 == (XMLCh *)0x0) {
      uVar4 = 0;
      do {
        psVar2 = (short *)((long)str1 + uVar4);
        uVar4 = uVar4 + 2;
      } while (*psVar2 != 0);
      return (int)(uVar4 >> 1) + -1;
    }
  }
  uVar3 = (uint)(ushort)*str1;
  XVar6 = *str2;
  if (*str1 == XVar6) {
    lVar5 = 2;
    do {
      if ((short)uVar3 == 0) {
        return 0;
      }
      pXVar1 = (XMLCh *)((long)str1 + lVar5);
      uVar3 = (uint)(ushort)*pXVar1;
      XVar6 = *(XMLCh *)((long)str2 + lVar5);
      lVar5 = lVar5 + 2;
    } while (*pXVar1 == XVar6);
  }
  return uVar3 - (ushort)XVar6;
}

Assistant:

int XMLString::compareString(   const   XMLCh* const    str1
                                , const XMLCh* const    str2)
{
    const XMLCh* psz1 = str1;
    const XMLCh* psz2 = str2;

    if (psz1 == 0 || psz2 == 0) {

        if (psz1 == 0) {
            return 0 - (int)XMLString::stringLen(psz2);
        }
		else if (psz2 == 0) {
            return (int)XMLString::stringLen(psz1);
        }
    }

    for (;;)
    {
        // If an inequality, then return the difference
        if (*psz1 != *psz2)
            return int(*psz1) - int(*psz2);

        // If either has ended, then they both ended, so equal
        if (!*psz1)
            break;

        // Move upwards for the next round
        psz1++;
        psz2++;
    }
    return 0;
}